

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall
Js::JavascriptArray::BigIndex::SetItemIfNotExist(BigIndex *this,JavascriptArray *arr,Var newValue)

{
  bool bVar1;
  PropertyId propertyId_00;
  BOOL BVar2;
  PropertyId propertyId;
  Var oldValue;
  PropertyRecord *propertyRecord;
  ScriptContext *scriptContext;
  Var newValue_local;
  JavascriptArray *arr_local;
  BigIndex *this_local;
  
  scriptContext = (ScriptContext *)newValue;
  newValue_local = arr;
  arr_local = (JavascriptArray *)this;
  bVar1 = IsSmallIndex(this);
  if (bVar1) {
    IndexTrace<unsigned_int>::SetItemIfNotExist
              ((JavascriptArray *)newValue_local,&this->index,scriptContext);
  }
  else {
    propertyRecord =
         (PropertyRecord *)RecyclableObject::GetScriptContext((RecyclableObject *)newValue_local);
    Js::JavascriptOperators::GetPropertyIdForInt
              (this->bigIndex,(ScriptContext *)propertyRecord,(PropertyRecord **)&oldValue);
    propertyId_00 = PropertyRecord::GetPropertyId((PropertyRecord *)oldValue);
    BVar2 = RecyclableObject::GetProperty
                      ((RecyclableObject *)newValue_local,newValue_local,propertyId_00,
                       (Var *)&stack0xffffffffffffffc8,(PropertyValueInfo *)0x0,
                       (ScriptContext *)propertyRecord);
    if (BVar2 == 0) {
      (**(code **)(*newValue_local + 0xb8))(newValue_local,propertyId_00,scriptContext,0,0);
    }
  }
  return;
}

Assistant:

void JavascriptArray::BigIndex::SetItemIfNotExist(JavascriptArray* arr, Var newValue) const
    {
        if (IsSmallIndex())
        {
            small_index::SetItemIfNotExist(arr, index, newValue);
        }
        else
        {
            ScriptContext* scriptContext = arr->GetScriptContext();
            PropertyRecord const * propertyRecord;
            JavascriptOperators::GetPropertyIdForInt(bigIndex, scriptContext, &propertyRecord);
            Var oldValue;
            PropertyId propertyId = propertyRecord->GetPropertyId();
            if (!arr->GetProperty(arr, propertyId, &oldValue, NULL, scriptContext))
            {
                arr->SetProperty(propertyId, newValue, PropertyOperation_None, NULL);
            }
        }
    }